

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::auto_insert_sync_reset(Generator *top)

{
  undefined1 local_a0 [8];
  InsertSyncReset visitor;
  Generator *top_local;
  
  visitor.sync_reset_name.field_2._8_8_ = top;
  InsertSyncReset::InsertSyncReset((InsertSyncReset *)local_a0,top);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_a0,(Generator *)visitor.sync_reset_name.field_2._8_8_);
  InsertSyncReset::~InsertSyncReset((InsertSyncReset *)local_a0);
  return;
}

Assistant:

void auto_insert_sync_reset(Generator* top) {
    InsertSyncReset visitor(top);
    visitor.visit_generator_root_p(top);
}